

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# channelout.cpp
# Opt level: O2

int anon_unknown.dwarf_22b2f::ChannelOut_aftertouch(lua_State *L)

{
  int iVar1;
  ChannelOut *this;
  ulong xs_1;
  ulong xs_1_00;
  
  this = getChannelOut(L,1);
  xs_1 = luaL_checkinteger(L,2);
  if (0x7f < xs_1) {
    luaL_argerror(L,2,"Aftertouch pressure must be between 0 and 127");
  }
  iVar1 = lua_type(L,3);
  if (iVar1 < 1) {
    ChannelOut::send<int,long>(this,this->index + 0xd0,xs_1);
  }
  else {
    xs_1_00 = luaL_checkinteger(L,3);
    if (0x7f < xs_1_00) {
      luaL_argerror(L,3,"Pitch must be between 0 and 127");
    }
    ChannelOut::send<int,long,long>(this,this->index + 0xa0,xs_1_00,xs_1);
  }
  lua_settop(L,1);
  return 1;
}

Assistant:

int ChannelOut_aftertouch(lua_State *L) {
	auto &self = getChannelOut(L, 1);
	lua_Integer pressure = luaL_checkinteger(L, 2);

	luaL_argcheck(L, pressure >= 0 && pressure <= 0x7F, 2, "Aftertouch pressure must be between 0 and 127");

	if (!lua_isnoneornil(L, 3)) {
		lua_Integer pitch = luaL_checkinteger(L, 3);
		luaL_argcheck(L, pitch >= 0 && pitch <= 0x7F, 3, "Pitch must be between 0 and 127");
		self.send(0xA0 + self.index, pitch, pressure);
	}
	else
		self.send(0xD0 + self.index, pressure);

	lua_settop(L, 1);
	return 1;
}